

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O2

void __thiscall string::unicode_multiple::test_method(unicode_multiple *this)

{
  undefined **local_118;
  undefined1 local_110;
  undefined8 *local_108;
  char *local_100;
  undefined4 local_f4;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  string local_d0;
  JSONParser parser;
  string json;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  std::__cxx11::string::string
            ((string *)&json,"\"This is \\u319e\\u20aC unicode\"",(allocator *)&parser);
  parser.p = json._M_dataplus._M_p;
  parser.pe = json._M_dataplus._M_p + json._M_string_length;
  parser.skipOverErrors = false;
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/matiu2[P]yajp/tests/parser/test_string.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  parser.eof = parser.pe;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x74);
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_001169d8;
  local_108 = &boost::unit_test::lazy_ostream::inst;
  local_100 = "";
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/matiu2[P]yajp/tests/parser/test_string.cpp"
  ;
  local_d8 = "";
  local_d0._M_dataplus._M_p._0_4_ = yajp::JSONParser::getNextType(&parser,false);
  local_f4 = 0x22;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,yajp::JSONParser::JSONType,yajp::JSONParser::JSONType>
            (&local_118,&local_e0,0x74,1,2,&local_d0,"parser.getNextType()",&local_f4,
             "yajp::JSONParser::string");
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/matiu2[P]yajp/tests/parser/test_string.cpp"
  ;
  local_58 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x75);
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_001169d8;
  local_108 = &boost::unit_test::lazy_ostream::inst;
  local_100 = "";
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/matiu2[P]yajp/tests/parser/test_string.cpp"
  ;
  local_e8 = "";
  yajp::JSONParser::readString_abi_cxx11_(&local_d0,&parser);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char[23],std::__cxx11::string>
            (&local_118,&local_f0,0x75,1,2,anon_var_dwarf_d812,
             "u8\"This is \\u319e\\u20aC unicode\"",&local_d0,"parser.readString()");
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&json);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( unicode_multiple ) {
    std::string json("\"This is \\u319e\\u20aC unicode\"");
    yajp::JSONParser parser(json);
    BOOST_CHECK_EQUAL(parser.getNextType(), yajp::JSONParser::string);
    BOOST_CHECK_EQUAL(u8"This is \u319e\u20aC unicode", parser.readString());
}